

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write.c
# Opt level: O2

archive_write_filter * filter_lookup(archive *_a,int n)

{
  archive_write_filter **ppaVar1;
  archive_write_filter *paVar2;
  archive_write *a;
  
  if (n == -1) {
    paVar2 = (archive_write_filter *)_a[1].read_data_block;
  }
  else {
    if (n < 0) {
      return (archive_write_filter *)0x0;
    }
    ppaVar1 = (archive_write_filter **)&_a[1].sconv;
    while ((paVar2 = *ppaVar1, 0 < n && (paVar2 != (archive_write_filter *)0x0))) {
      n = n + -1;
      ppaVar1 = &paVar2->next_filter;
    }
  }
  return paVar2;
}

Assistant:

static struct archive_write_filter *
filter_lookup(struct archive *_a, int n)
{
	struct archive_write *a = (struct archive_write *)_a;
	struct archive_write_filter *f = a->filter_first;
	if (n == -1)
		return a->filter_last;
	if (n < 0)
		return NULL;
	while (n > 0 && f != NULL) {
		f = f->next_filter;
		--n;
	}
	return f;
}